

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_Test::testBody
          (TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_Test *this)

{
  PlayerHand *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  int iVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  _Rb_tree_header *p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  int value;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  SimpleString local_b8;
  SimpleString local_b0;
  TestTerminatorWithoutExceptions local_a8;
  DoublingFactorReport r;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h;
  mahjong::PlayerHand::add(this_00,OneOfCharacters);
  mahjong::PlayerHand::add(this_00,OneOfCharacters);
  mahjong::PlayerHand::add(this_00,NineOfCharacters);
  mahjong::PlayerHand::add(this_00,NineOfCharacters);
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  mahjong::PlayerHand::add(this_00,OneOfCircles);
  mahjong::PlayerHand::add(this_00,NineOfCircles);
  mahjong::PlayerHand::add(this_00,NineOfCircles);
  mahjong::PlayerHand::add(this_00,NineOfBamboos);
  mahjong::PlayerHand::add(this_00,NineOfBamboos);
  mahjong::PlayerHand::add(this_00,WhiteDragon);
  mahjong::PlayerHand::add(this_00,WhiteDragon);
  mahjong::PlayerHand::add(this_00,WestWind);
  mahjong::PlayerHand::add(this_00,WestWind);
  mahjong::WiningState::winByDiscard
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,
             (WinByDiscardSituation)0x0);
  mahjong::DoubligFactorCounter::report
            (&r,&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  p_Var1 = &r.patterns._M_t._M_impl.super__Rb_tree_header;
  value = (int)&local_b8;
  p_Var9 = &p_Var1->_M_header;
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
  goto LAB_0016d532;
  do {
    p_Var8 = p_Var10;
    p_Var13 = p_Var9;
    _Var2 = p_Var8[1]._M_color;
    p_Var9 = p_Var8;
    if ((int)_Var2 < 0x20) {
      p_Var9 = p_Var13;
    }
    p_Var10 = (&p_Var8->_M_left)[(int)_Var2 < 0x20];
  } while ((&p_Var8->_M_left)[(int)_Var2 < 0x20] != (_Base_ptr)0x0);
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
LAB_0016d438:
    do {
      p_Var12 = (_Rb_tree_header *)p_Var11;
      p_Var9 = p_Var10;
      iVar3 = (int)*(size_t *)(p_Var9 + 1);
      p_Var11 = p_Var9;
      if (iVar3 < 0x20) {
        p_Var11 = &p_Var12->_M_header;
      }
      p_Var10 = (&p_Var9->_M_left)[iVar3 < 0x20];
    } while ((&p_Var9->_M_left)[iVar3 < 0x20] != (_Base_ptr)0x0);
    p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &p_Var1->_M_header;
    p_Var7 = p_Var1;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      if (iVar3 < 0x20) {
        p_Var9 = &p_Var12->_M_header;
      }
      p_Var7 = (_Rb_tree_header *)p_Var11;
      if (0x20 < (int)((_Rb_tree_header *)p_Var9)->_M_node_count) {
        p_Var7 = p_Var1;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var8;
      p_Var9 = p_Var10;
      iVar3 = (int)*(size_t *)(p_Var9 + 1);
      p_Var8 = p_Var9;
      if (iVar3 < 0x20) {
        p_Var8 = &p_Var12->_M_header;
      }
      p_Var10 = (&p_Var9->_M_left)[iVar3 < 0x20];
    } while ((&p_Var9->_M_left)[iVar3 < 0x20] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var8 == p_Var1) {
      if (p_Var7 != p_Var1) goto LAB_0016d50d;
    }
    else {
      if (iVar3 < 0x20) {
        p_Var9 = &p_Var12->_M_header;
      }
      if (0x20 < (int)((_Rb_tree_header *)p_Var9)->_M_node_count == (p_Var7 != p_Var1)) {
LAB_0016d50d:
        pUVar4 = UtestShell::getCurrent();
        (*pUVar4->_vptr_UtestShell[0x1b])
                  (pUVar4,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x22b);
      }
    }
LAB_0016d532:
    pUVar4 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_b8);
    for (p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < 0x20]) {
    }
    StringFrom((unsigned_long)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x22b,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  else {
    if ((int)_Var2 < 0x20) {
      p_Var8 = p_Var13;
    }
    if (0x20 < (int)p_Var8[1]._M_color) goto LAB_0016d438;
    pUVar4 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x22b,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  p_Var9 = &p_Var1->_M_header;
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
  goto LAB_0016d76a;
  do {
    p_Var8 = p_Var10;
    p_Var13 = p_Var9;
    _Var2 = p_Var8[1]._M_color;
    p_Var9 = p_Var8;
    if ((int)_Var2 < 0x1a) {
      p_Var9 = p_Var13;
    }
    p_Var10 = (&p_Var8->_M_left)[(int)_Var2 < 0x1a];
  } while ((&p_Var8->_M_left)[(int)_Var2 < 0x1a] != (_Base_ptr)0x0);
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var11 = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var9 == p_Var1) {
LAB_0016d670:
    do {
      p_Var12 = (_Rb_tree_header *)p_Var11;
      p_Var9 = p_Var10;
      iVar3 = (int)*(size_t *)(p_Var9 + 1);
      p_Var11 = p_Var9;
      if (iVar3 < 0x1a) {
        p_Var11 = &p_Var12->_M_header;
      }
      p_Var10 = (&p_Var9->_M_left)[iVar3 < 0x1a];
    } while ((&p_Var9->_M_left)[iVar3 < 0x1a] != (_Base_ptr)0x0);
    p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = &p_Var1->_M_header;
    p_Var7 = p_Var1;
    if ((_Rb_tree_header *)p_Var11 != p_Var1) {
      if (iVar3 < 0x1a) {
        p_Var9 = &p_Var12->_M_header;
      }
      p_Var7 = (_Rb_tree_header *)p_Var11;
      if (0x1a < (int)((_Rb_tree_header *)p_Var9)->_M_node_count) {
        p_Var7 = p_Var1;
      }
    }
    do {
      p_Var12 = (_Rb_tree_header *)p_Var8;
      p_Var9 = p_Var10;
      iVar3 = (int)*(size_t *)(p_Var9 + 1);
      p_Var8 = p_Var9;
      if (iVar3 < 0x1a) {
        p_Var8 = &p_Var12->_M_header;
      }
      p_Var10 = (&p_Var9->_M_left)[iVar3 < 0x1a];
    } while ((&p_Var9->_M_left)[iVar3 < 0x1a] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var8 == p_Var1) {
      if (p_Var7 != p_Var1) goto LAB_0016d745;
    }
    else {
      if (iVar3 < 0x1a) {
        p_Var9 = &p_Var12->_M_header;
      }
      if (0x1a < (int)((_Rb_tree_header *)p_Var9)->_M_node_count == (p_Var7 != p_Var1)) {
LAB_0016d745:
        pUVar4 = UtestShell::getCurrent();
        (*pUVar4->_vptr_UtestShell[0x1b])
                  (pUVar4,
                   "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x22c);
      }
    }
LAB_0016d76a:
    pUVar4 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_b8);
    for (p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < 0x1a]) {
    }
    StringFrom((unsigned_long)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x22c,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  else {
    if ((int)_Var2 < 0x1a) {
      p_Var8 = p_Var13;
    }
    if (0x1a < (int)p_Var8[1]._M_color) goto LAB_0016d670;
    pUVar4 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x22c,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  p_Var9 = &p_Var1->_M_header;
  p_Var10 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    do {
      p_Var8 = p_Var10;
      p_Var13 = p_Var9;
      _Var2 = p_Var8[1]._M_color;
      p_Var9 = p_Var8;
      if ((int)_Var2 < 0x19) {
        p_Var9 = p_Var13;
      }
      p_Var10 = (&p_Var8->_M_left)[(int)_Var2 < 0x19];
    } while ((&p_Var8->_M_left)[(int)_Var2 < 0x19] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      if ((int)_Var2 < 0x19) {
        p_Var8 = p_Var13;
      }
      p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var10 = &p_Var1->_M_header;
      if ((int)p_Var8[1]._M_color < 0x1a) {
        do {
          p_Var12 = (_Rb_tree_header *)p_Var10;
          p_Var8 = p_Var9;
          iVar3 = (int)*(size_t *)(p_Var8 + 1);
          p_Var10 = p_Var8;
          if (iVar3 < 0x19) {
            p_Var10 = &p_Var12->_M_header;
          }
          p_Var9 = (&p_Var8->_M_left)[iVar3 < 0x19];
        } while ((&p_Var8->_M_left)[iVar3 < 0x19] != (_Base_ptr)0x0);
        p_Var9 = r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 = &p_Var1->_M_header;
        p_Var7 = p_Var1;
        if ((_Rb_tree_header *)p_Var10 != p_Var1) {
          if (iVar3 < 0x19) {
            p_Var8 = &p_Var12->_M_header;
          }
          p_Var7 = (_Rb_tree_header *)p_Var10;
          if (0x19 < (int)((_Rb_tree_header *)p_Var8)->_M_node_count) {
            p_Var7 = p_Var1;
          }
        }
        do {
          p_Var12 = (_Rb_tree_header *)p_Var13;
          p_Var10 = p_Var9;
          iVar3 = (int)*(size_t *)(p_Var10 + 1);
          p_Var13 = p_Var10;
          if (iVar3 < 0x19) {
            p_Var13 = &p_Var12->_M_header;
          }
          p_Var9 = (&p_Var10->_M_left)[iVar3 < 0x19];
        } while ((&p_Var10->_M_left)[iVar3 < 0x19] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var13 == p_Var1) {
          if (p_Var7 != p_Var1) goto LAB_0016daa9;
        }
        else {
          if (iVar3 < 0x19) {
            p_Var10 = &p_Var12->_M_header;
          }
          if (0x19 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count == (p_Var7 != p_Var1)) {
LAB_0016daa9:
            pUVar4 = UtestShell::getCurrent();
            (*pUVar4->_vptr_UtestShell[0x1b])
                      (pUVar4,
                       "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                       ,0x22d);
          }
        }
        pUVar4 = UtestShell::getCurrent();
        StringFrom(value);
        pcVar5 = SimpleString::asCharString(&local_b8);
        for (; r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0;
            r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (&(r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
                 [(int)r.patterns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]._M_color
                  < 0x19]) {
        }
        StringFrom((unsigned_long)&local_b0);
        pcVar6 = SimpleString::asCharString(&local_b0);
        local_a8.super_TestTerminator._vptr_TestTerminator =
             (TestTerminator)&PTR_exitCurrentTest_001e18b8;
        (*pUVar4->_vptr_UtestShell[0x16])
                  (pUVar4,1,pcVar5,pcVar6,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                   ,0x22d,&local_a8);
        TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
        SimpleString::~SimpleString(&local_b0);
        SimpleString::~SimpleString(&local_b8);
        goto LAB_0016d8e6;
      }
    }
  }
  pUVar4 = UtestShell::getCurrent();
  local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,0,0,0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
             ,0x22d,&local_b8);
  TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
            ((TestTerminatorWithoutExceptions *)&local_b8);
LAB_0016d8e6:
  if (r.doubling_factor == 4) {
    pUVar4 = UtestShell::getCurrent();
    local_b8.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x22e,&local_b8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_b8);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_b8);
    StringFrom((int)&local_b0);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_a8.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x22e,&local_a8);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_a8);
    SimpleString::~SimpleString(&local_b0);
    SimpleString::~SimpleString(&local_b8);
  }
  std::
  _Rb_tree<mahjong::Pattern,_mahjong::Pattern,_std::_Identity<mahjong::Pattern>,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
  ::~_Rb_tree(&r.patterns._M_t);
  if (r.wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(r.wining_hand.tiles.
                    super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)r.wining_hand.tiles.
                          super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector(&r.wining_hand.melds);
  std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::~vector
            ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&r);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTerminalsAndHornors_SevenPairs)
{
	addPair(Tile::OneOfCharacters);
	addPair(Tile::NineOfCharacters);
	addPair(Tile::OneOfCircles);
	addPair(Tile::NineOfCircles);
	addPair(Tile::NineOfBamboos);
	addPair(Tile::WhiteDragon);
	addPair(Tile::WestWind);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTerminalsAndHornors));
	CHECK_EQUAL(1, r.patterns.count(Pattern::SevenPairs));
	CHECK_EQUAL(0, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(4, r.doubling_factor);
}